

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLUtils.hpp
# Opt level: O2

void Diligent::HandleHLSLCompilerResult<IDxcBlob>
               (bool CompilationSucceeded,IDxcBlob *pCompilerMsgBlob,string *ShaderSource,
               char *ShaderName,IDataBlob **ppOutputLog)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n_00;
  void *__dest;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  char *pcVar4;
  void *local_218;
  string _msg;
  Diligent local_1d8 [32];
  RefCntAutoPtr<Diligent::DataBlobImpl> pOutputLogBlob;
  ostream local_1a8 [376];
  undefined4 extraout_var_00;
  
  if (pCompilerMsgBlob == (IDxcBlob *)0x0) {
LAB_0031e3e3:
    bVar1 = false;
    local_218 = (void *)0x0;
    __n_00 = 0;
  }
  else {
    iVar2 = (*(pCompilerMsgBlob->super_IUnknown)._vptr_IUnknown[3])(pCompilerMsgBlob);
    local_218 = (void *)CONCAT44(extraout_var,iVar2);
    if (local_218 == (void *)0x0) goto LAB_0031e3e3;
    iVar2 = (*(pCompilerMsgBlob->super_IUnknown)._vptr_IUnknown[4])(pCompilerMsgBlob);
    __n_00 = CONCAT44(extraout_var_00,iVar2);
    bVar1 = true;
  }
  if (ppOutputLog != (IDataBlob **)0x0) {
    __n = ShaderSource->_M_string_length;
    DataBlobImpl::Create((DataBlobImpl *)&pOutputLogBlob,__n_00 + __n + 2,(void *)0x0);
    __dest = DataBlobImpl::GetDataPtr(pOutputLogBlob.m_pObject,0);
    if (bVar1) {
      memcpy(__dest,local_218,__n_00);
    }
    *(undefined1 *)((long)__dest + __n_00) = 0;
    memcpy((void *)((long)__dest + __n_00 + 1),(ShaderSource->_M_dataplus)._M_p,__n);
    *(undefined1 *)((long)__dest + __n + 1 + __n_00) = 0;
    DataBlobImpl::QueryInterface
              (pOutputLogBlob.m_pObject,(INTERFACE_ID *)IID_DataBlob,(IObject **)ppOutputLog);
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release(&pOutputLogBlob);
  }
  if (__n_00 == 0 && CompilationSucceeded) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&pOutputLogBlob);
  pcVar4 = "Failed to compile shader \'";
  if (CompilationSucceeded) {
    pcVar4 = "Compiler output for shader \'";
  }
  poVar3 = std::operator<<(local_1a8,pcVar4);
  pcVar4 = "<unknown>";
  if (ShaderName != (char *)0x0) {
    pcVar4 = ShaderName;
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,"\'");
  if (bVar1 && __n_00 != 0) {
    poVar3 = std::operator<<(local_1a8,":");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    _msg._M_dataplus._M_p = (pointer)&_msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&_msg,local_218,__n_00 + (long)local_218);
    std::operator<<(poVar3,(string *)&_msg);
    std::__cxx11::string::~string((string *)&_msg);
    if (CompilationSucceeded) {
LAB_0031e55e:
      std::__cxx11::stringbuf::str();
      FormatString<std::__cxx11::string>(&_msg,local_1d8,Args);
      std::__cxx11::string::~string((string *)local_1d8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
      }
      goto LAB_0031e5e2;
    }
  }
  else {
    if (CompilationSucceeded) goto LAB_0031e55e;
    std::operator<<(local_1a8," (no shader log available).");
  }
  std::__cxx11::stringbuf::str();
  LogError<true,std::__cxx11::string>
            (false,"HandleHLSLCompilerResult",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/HLSLUtils.hpp"
             ,0x60,&_msg);
LAB_0031e5e2:
  std::__cxx11::string::~string((string *)&_msg);
  std::__cxx11::stringstream::~stringstream((stringstream *)&pOutputLogBlob);
  return;
}

Assistant:

void HandleHLSLCompilerResult(bool               CompilationSucceeded,
                              BlobType*          pCompilerMsgBlob,
                              const std::string& ShaderSource,
                              const char*        ShaderName,
                              IDataBlob**        ppOutputLog) noexcept(false)
{
    const char*  CompilerMsg    = pCompilerMsgBlob ? static_cast<const char*>(pCompilerMsgBlob->GetBufferPointer()) : nullptr;
    const size_t CompilerMsgLen = CompilerMsg ? pCompilerMsgBlob->GetBufferSize() : 0;

    if (ppOutputLog != nullptr)
    {
        const size_t                ShaderSourceLen = ShaderSource.length();
        RefCntAutoPtr<DataBlobImpl> pOutputLogBlob  = DataBlobImpl::Create(ShaderSourceLen + 1 + CompilerMsgLen + 1);

        char* log = pOutputLogBlob->GetDataPtr<char>();

        if (CompilerMsg != nullptr)
            memcpy(log, CompilerMsg, CompilerMsgLen);
        log[CompilerMsgLen] = 0; // Explicitly set null terminator
        log += CompilerMsgLen + 1;

        memcpy(log, ShaderSource.data(), ShaderSourceLen);
        log[ShaderSourceLen] = 0;

        pOutputLogBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppOutputLog));
    }

    if (!CompilationSucceeded || CompilerMsgLen != 0)
    {
        std::stringstream ss;
        ss << (CompilationSucceeded ? "Compiler output for shader '" : "Failed to compile shader '")
           << (ShaderName != nullptr ? ShaderName : "<unknown>")
           << "'";
        if (CompilerMsg != nullptr && CompilerMsgLen != 0)
        {
            ss << ":" << std::endl
               << std::string{CompilerMsg, CompilerMsgLen};
        }
        else if (!CompilationSucceeded)
        {
            ss << " (no shader log available).";
        }

        if (CompilationSucceeded)
        {
            LOG_INFO_MESSAGE(ss.str());
        }
        else
        {
            LOG_ERROR_AND_THROW(ss.str());
        }
    }
}